

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_context_reg_write_batch(uc_context *ctx,int *regs,void **vals,int count)

{
  uc_err uVar1;
  size_t sStack_70;
  uc_err err;
  size_t size;
  void *value;
  uint regid;
  int i;
  int setpc;
  int mode;
  void *env;
  reg_write_t local_40;
  reg_write_t local_38;
  reg_write_t reg_write;
  void **ppvStack_28;
  int count_local;
  void **vals_local;
  int *regs_local;
  uc_context *ctx_local;
  
  reg_write._4_4_ = count;
  ppvStack_28 = vals;
  vals_local = (void **)regs;
  regs_local = (int *)ctx;
  _env = find_context_reg_rw(ctx->arch,ctx->mode);
  local_38 = local_40;
  _setpc = regs_local + 5;
  i = regs_local[2];
  regid = 0;
  value._4_4_ = 0;
  while( true ) {
    if (reg_write._4_4_ <= value._4_4_) {
      return UC_ERR_OK;
    }
    value._0_4_ = *(uint *)((long)vals_local + (long)value._4_4_ * 4);
    size = (size_t)ppvStack_28[value._4_4_];
    sStack_70 = 0xffffffffffffffff;
    uVar1 = (*local_38)(_setpc,i,(uint)value,(void *)size,&stack0xffffffffffffff90,(int *)&regid);
    if (uVar1 != UC_ERR_OK) break;
    value._4_4_ = value._4_4_ + 1;
  }
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_write_batch(uc_context *ctx, int *regs, void *const *vals,
                                  int count)
{
    reg_write_t reg_write = find_context_reg_rw(ctx->arch, ctx->mode).write;
    void *env = ctx->data;
    int mode = ctx->mode;
    int setpc = 0;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        const void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_write(env, mode, regid, value, &size, &setpc);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}